

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_impl.h
# Opt level: O3

char * google::protobuf::internal::TcParser::
       GenericFallbackImpl<google::protobuf::MessageLite,std::__cxx11::string>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ulong uVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint *puVar3;
  ExtensionSet *this;
  uint tag;
  
  if (ptr == (char *)0x0) {
    ptr = (char *)&GenericFallbackImpl<google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::kOps;
  }
  else {
    if ((ulong)table->has_bits_offset != 0) {
      puVar3 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar3 & 3) != 0) {
        AlignFail();
      }
      *puVar3 = *puVar3 | (uint)hasbits;
    }
    tag = data.field_0._0_4_;
    if (tag != 0 && (tag & 7) != 4) {
      if ((ulong)table->extension_offset == 0) {
        uVar1 = (msg->_internal_metadata_).ptr_;
        if ((uVar1 & 1) == 0) {
          unknown = InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>
                              (&msg->_internal_metadata_);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((uVar1 & 0xfffffffffffffffe) + 8);
        }
        pcVar2 = UnknownFieldParse(tag,unknown,ptr,ctx);
        return pcVar2;
      }
      this = (ExtensionSet *)((long)&msg->_vptr_MessageLite + (ulong)table->extension_offset);
      if (((ulong)this & 7) == 0) {
        pcVar2 = ExtensionSet::ParseField
                           (this,(ulong)data.field_0 & 0xffffffff,ptr,table->class_data->prototype,
                            &msg->_internal_metadata_,ctx);
        return pcVar2;
      }
      AlignFail();
    }
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
  }
  return (char *)(UnknownFieldOps *)ptr;
}

Assistant:

PROTOBUF_CC static const char* GenericFallbackImpl(PROTOBUF_TC_PARAM_DECL) {
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
      // This is the ABI used by GetUnknownFieldOps(). Return the vtable.
      static constexpr UnknownFieldOps kOps = {
          WriteVarintToUnknown<UnknownFieldsT>,
          WriteLengthDelimitedToUnknown<UnknownFieldsT>};
      return reinterpret_cast<const char*>(&kOps);
    }

    SyncHasbits(msg, hasbits, table);
    uint32_t tag = data.tag();
    if ((tag & 7) == WireFormatLite::WIRETYPE_END_GROUP || tag == 0) {
      ctx->SetLastTag(tag);
      return ptr;
    }

    if (table->extension_offset != 0) {
      // We don't need to check the extension ranges. If it is not an extension
      // it will be handled just like if it was an unknown extension: sent to
      // the unknown field set.
      return RefAt<ExtensionSet>(msg, table->extension_offset)
          .ParseField(
              tag, ptr,
              static_cast<const MessageBaseT*>(table->default_instance()),
              &msg->_internal_metadata_, ctx);
    } else {
      // Otherwise, we directly put it on the unknown field set.
      return UnknownFieldParse(
          tag,
          msg->_internal_metadata_.mutable_unknown_fields<UnknownFieldsT>(),
          ptr, ctx);
    }
  }